

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O1

void __thiscall
chrono::ChFrameMoving<double>::ArchiveOUT(ChFrameMoving<double> *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChCoordsys<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChFrameMoving<double>>(marchive);
  ChArchiveOut::VersionWrite<chrono::ChFrame<double>>(marchive);
  local_38._value = &(this->super_ChFrame<double>).coord;
  local_38._name = "coord";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChCoordsys<double>>(marchive,&local_38);
  local_38._value = &this->coord_dt;
  local_38._name = "coord_dt";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChCoordsys<double>>(marchive,&local_38);
  local_38._value = &this->coord_dtdt;
  local_38._name = "coord_dtdt";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChCoordsys<double>>(marchive,&local_38);
  return;
}

Assistant:

virtual void ArchiveOUT(ChArchiveOut& marchive) override {
        // version number
        marchive.VersionWrite<ChFrameMoving>();

        // serialize parent class
        ChFrame<Real>::ArchiveOUT(marchive);

        // serialize all member data
        marchive << CHNVP(coord_dt);
        marchive << CHNVP(coord_dtdt);
    }